

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy-stubs-internal.h
# Opt level: O3

bool duckdb_snappy::GetUncompressedLength(char *start,size_t n,size_t *result)

{
  uint uVar1;
  uchar *ptr;
  
  if ((long)n < 1) {
    return false;
  }
  uVar1 = (byte)*start & 0x7f;
  if (*start < '\0') {
    if (n == 1) {
      return false;
    }
    uVar1 = uVar1 | ((byte)start[1] & 0x7f) << 7;
    if (start[1] < '\0') {
      if (n < 3) {
        return false;
      }
      uVar1 = uVar1 | ((byte)start[2] & 0x7f) << 0xe;
      if (start[2] < '\0') {
        if (n == 3) {
          return false;
        }
        uVar1 = uVar1 | ((byte)start[3] & 0x7f) << 0x15;
        if (start[3] < '\0') {
          if (n < 5) {
            return false;
          }
          if (0xf < (byte)start[4]) {
            return false;
          }
          uVar1 = uVar1 | (uint)(byte)start[4] << 0x1c;
        }
      }
    }
  }
  *result = (ulong)uVar1;
  return true;
}

Assistant:

inline const char* Varint::Parse32WithLimit(const char* p,
                                            const char* l,
                                            uint32_t* OUTPUT) {
  const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
  const unsigned char* limit = reinterpret_cast<const unsigned char*>(l);
  uint32_t b, result;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result = b & 127;          if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) <<  7; if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) << 14; if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) << 21; if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) << 28; if (b < 16) goto done;
  return NULL;       // Value is too long to be a varint32
 done:
  *OUTPUT = result;
  return reinterpret_cast<const char*>(ptr);
}